

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

bool __thiscall
testing::internal::ValuesInIteratorRangeGenerator<BloatyTestEntry>::Iterator::Equals
          (Iterator *this,ParamIteratorInterface<BloatyTestEntry> *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Iterator *pIVar4;
  GTestLog local_1c;
  
  iVar2 = (*(this->super_ParamIteratorInterface<BloatyTestEntry>)._vptr_ParamIteratorInterface[2])()
  ;
  iVar3 = (*other->_vptr_ParamIteratorInterface[2])(other);
  bVar1 = IsTrue(CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3));
  if (!bVar1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x152);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition BaseGenerator() == other.BaseGenerator() failed. ",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The program attempted to compare iterators ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"from different generators.",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    GTestLog::~GTestLog(&local_1c);
  }
  pIVar4 = CheckedDowncastToActualType<testing::internal::ValuesInIteratorRangeGenerator<BloatyTestEntry>::Iterator_const,testing::internal::ParamIteratorInterface<BloatyTestEntry>const>
                     (other);
  return (this->iterator_)._M_current == (pIVar4->iterator_)._M_current;
}

Assistant:

bool Equals(const ParamIteratorInterface<T>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      return iterator_ ==
          CheckedDowncastToActualType<const Iterator>(&other)->iterator_;
    }